

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O1

int Pdr_SetCompare(Pdr_Set_t **pp1,Pdr_Set_t **pp2)

{
  uint uVar1;
  uint uVar2;
  Pdr_Set_t *pPVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  pPVar3 = *pp2;
  uVar1 = (*pp1)->nLits;
  uVar6 = (ulong)(int)uVar1;
  bVar9 = 0 < (long)uVar6;
  if ((long)uVar6 < 1) {
    uVar7 = 0;
  }
  else {
    uVar2 = pPVar3->nLits;
    uVar7 = 0;
    if (0 < (int)uVar2) {
      uVar4 = 0;
      do {
        uVar8 = uVar4;
        iVar5 = *(int *)(&(*pp1)->field_0x14 + uVar8 * 4);
        if (*(int *)(&pPVar3->field_0x14 + uVar8 * 4) < iVar5) {
          return -1;
        }
        if (iVar5 < *(int *)(&pPVar3->field_0x14 + uVar8 * 4)) {
          return 1;
        }
        uVar7 = uVar1;
      } while ((uVar6 - 1 != uVar8) && (uVar4 = uVar8 + 1, uVar7 = uVar2, (ulong)uVar2 != uVar8 + 1)
              );
      bVar9 = uVar8 + 1 < uVar6;
    }
  }
  if (((uVar7 != uVar1) || (iVar5 = -1, pPVar3->nLits <= (int)uVar7)) &&
     ((!bVar9 || (iVar5 = 1, uVar7 != pPVar3->nLits)))) {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int Pdr_SetCompare( Pdr_Set_t ** pp1, Pdr_Set_t ** pp2 )
{
    Pdr_Set_t * p1 = *pp1;
    Pdr_Set_t * p2 = *pp2;
    int i;
    for ( i = 0; i < p1->nLits && i < p2->nLits; i++ )
    {
        if ( p1->Lits[i] > p2->Lits[i] )
            return -1;
        if ( p1->Lits[i] < p2->Lits[i] )
            return 1;
    }
    if ( i == p1->nLits && i < p2->nLits )
        return -1;
    if ( i < p1->nLits && i == p2->nLits )
        return 1;
    return 0;
}